

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

xmlChar * xmlParseEncodingDecl(xmlParserCtxtPtr ctxt)

{
  xmlChar xVar1;
  xmlParserInputPtr pxVar2;
  xmlParserErrors code;
  xmlChar *pxVar3;
  
  xmlSkipBlankChars(ctxt);
  pxVar2 = ctxt->input;
  pxVar3 = pxVar2->cur;
  if (((((*pxVar3 == 'e') && (pxVar3[1] == 'n')) && (pxVar3[2] == 'c')) &&
      ((pxVar3[3] == 'o' && (pxVar3[4] == 'd')))) &&
     ((pxVar3[5] == 'i' && ((pxVar3[6] == 'n' && (pxVar3[7] == 'g')))))) {
    pxVar2->cur = pxVar3 + 8;
    pxVar2->col = pxVar2->col + 8;
    if (pxVar3[8] == '\0') {
      xmlParserGrow(ctxt);
    }
    xmlSkipBlankChars(ctxt);
    if (*ctxt->input->cur != '=') {
      code = XML_ERR_EQUAL_REQUIRED;
LAB_00136490:
      xmlFatalErr(ctxt,code,(char *)0x0);
      return (xmlChar *)0x0;
    }
    xmlNextChar(ctxt);
    xmlSkipBlankChars(ctxt);
    xVar1 = *ctxt->input->cur;
    if (xVar1 == '\'') {
      xmlNextChar(ctxt);
      pxVar3 = xmlParseEncName(ctxt);
      if (*ctxt->input->cur != '\'') {
LAB_0013646d:
        xmlFatalErr(ctxt,XML_ERR_STRING_NOT_CLOSED,(char *)0x0);
        (*xmlFree)(pxVar3);
        return (xmlChar *)0x0;
      }
    }
    else {
      if (xVar1 != '\"') {
        code = XML_ERR_STRING_NOT_STARTED;
        goto LAB_00136490;
      }
      xmlNextChar(ctxt);
      pxVar3 = xmlParseEncName(ctxt);
      if (*ctxt->input->cur != '\"') goto LAB_0013646d;
    }
    xmlNextChar(ctxt);
    if (pxVar3 != (xmlChar *)0x0) {
      xmlSetDeclaredEncoding(ctxt,pxVar3);
      return ctxt->encoding;
    }
  }
  return (xmlChar *)0x0;
}

Assistant:

const xmlChar *
xmlParseEncodingDecl(xmlParserCtxtPtr ctxt) {
    xmlChar *encoding = NULL;

    SKIP_BLANKS;
    if (CMP8(CUR_PTR, 'e', 'n', 'c', 'o', 'd', 'i', 'n', 'g') == 0)
        return(NULL);

    SKIP(8);
    SKIP_BLANKS;
    if (RAW != '=') {
        xmlFatalErr(ctxt, XML_ERR_EQUAL_REQUIRED, NULL);
        return(NULL);
    }
    NEXT;
    SKIP_BLANKS;
    if (RAW == '"') {
        NEXT;
        encoding = xmlParseEncName(ctxt);
        if (RAW != '"') {
            xmlFatalErr(ctxt, XML_ERR_STRING_NOT_CLOSED, NULL);
            xmlFree((xmlChar *) encoding);
            return(NULL);
        } else
            NEXT;
    } else if (RAW == '\''){
        NEXT;
        encoding = xmlParseEncName(ctxt);
        if (RAW != '\'') {
            xmlFatalErr(ctxt, XML_ERR_STRING_NOT_CLOSED, NULL);
            xmlFree((xmlChar *) encoding);
            return(NULL);
        } else
            NEXT;
    } else {
        xmlFatalErr(ctxt, XML_ERR_STRING_NOT_STARTED, NULL);
    }

    if (encoding == NULL)
        return(NULL);

    xmlSetDeclaredEncoding(ctxt, encoding);

    return(ctxt->encoding);
}